

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O3

RTPTime __thiscall
jrtplib::RTCPScheduler::CalculateDeterministicInterval(RTCPScheduler *this,bool sender)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  double dVar4;
  RTPTime RVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  iVar1 = this->sources->sendercount;
  iVar3 = this->sources->activecount;
  iVar3 = iVar3 + (uint)(iVar3 == 0);
  dVar6 = (double)iVar1;
  dVar4 = (double)iVar3;
  dVar7 = (this->schedparams).senderfraction;
  if (dVar6 / dVar4 <= dVar7) {
    if (sender) {
      dVar7 = dVar7 * (this->schedparams).bandwidth;
    }
    else {
      dVar7 = (1.0 - dVar7) * (this->schedparams).bandwidth;
      dVar6 = (double)(iVar3 - iVar1);
    }
  }
  else {
    dVar7 = (this->schedparams).bandwidth;
    dVar6 = dVar4;
  }
  sVar2 = this->avgrtcppacksize;
  RVar5.m_t = (this->schedparams).mininterval.m_t;
  if ((this->hassentrtcp == false) && ((this->schedparams).usehalfatstartup == true)) {
    RVar5.m_t = RVar5.m_t * 0.5;
  }
  auVar8._8_4_ = (int)(sVar2 >> 0x20);
  auVar8._0_8_ = sVar2;
  auVar8._12_4_ = 0x45300000;
  dVar6 = dVar6 * (((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) / dVar7);
  if (RVar5.m_t <= dVar6) {
    RVar5.m_t = dVar6;
  }
  return (RTPTime)RVar5.m_t;
}

Assistant:

RTPTime RTCPScheduler::CalculateDeterministicInterval(bool sender /* = false */)
{
	int numsenders = sources.GetSenderCount();
	int numtotal = sources.GetActiveMemberCount();

//	std::cout << "CalculateDeterministicInterval" << std::endl;
//	std::cout << "  numsenders: " << numsenders << std::endl;
//	std::cout << "  numtotal: " << numtotal << std::endl;

	// Try to avoid division by zero:
	if (numtotal == 0)
		numtotal++;

	double sfraction = ((double)numsenders)/((double)numtotal);
	double C,n;

	if (sfraction <= schedparams.GetSenderBandwidthFraction())
	{
		if (sender)
		{
			C = ((double)avgrtcppacksize)/(schedparams.GetSenderBandwidthFraction()*schedparams.GetRTCPBandwidth());
			n = (double)numsenders;
		}
		else
		{
			C = ((double)avgrtcppacksize)/((1.0-schedparams.GetSenderBandwidthFraction())*schedparams.GetRTCPBandwidth());
			n = (double)(numtotal-numsenders);
		}
	}
	else
	{
		C = ((double)avgrtcppacksize)/schedparams.GetRTCPBandwidth();
		n = (double)numtotal;
	}
	
	RTPTime Tmin = schedparams.GetMinimumTransmissionInterval();
	double tmin = Tmin.GetDouble();
	
	if (!hassentrtcp && schedparams.GetUseHalfAtStartup())
		tmin /= 2.0;

	double ntimesC = n*C;
	double Td = (tmin>ntimesC)?tmin:ntimesC;

	// TODO: for debugging
//	std::cout << "  Td: " << Td << std::endl;

	return RTPTime(Td);
}